

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O1

DescriptorKeyReference * __thiscall
cfd::core::DescriptorNode::GetKeyReferences
          (DescriptorKeyReference *__return_storage_ptr__,DescriptorNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *array_argument)

{
  DescriptorKeyType DVar1;
  pointer pcVar2;
  pointer pbVar3;
  pointer puVar4;
  pointer pcVar5;
  undefined8 uVar6;
  pointer puVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  uint32_t child_num;
  long lVar11;
  CfdException *pCVar12;
  byte bVar13;
  _Alloc_hider _Var14;
  string *arg;
  Pubkey pubkey;
  string using_key;
  ExtPubkey xpub;
  KeyData key_data;
  string arg_value;
  ByteData256 tweak_sum;
  ExtPrivkey xpriv;
  Pubkey local_570;
  undefined1 local_558 [32];
  pointer puStack_538;
  pointer puStack_530;
  pointer puStack_528;
  pointer puStack_520;
  pointer local_518;
  pointer puStack_510;
  pointer local_508;
  pointer puStack_500;
  pointer local_4f8;
  pointer puStack_4f0;
  pointer puStack_4e8;
  pointer local_4e0;
  pointer puStack_4d8;
  pointer puStack_4d0;
  bool local_4c8;
  undefined3 uStack_4c7;
  NetType NStack_4c4;
  pointer puStack_4c0;
  pointer local_4b8;
  pointer puStack_4b0;
  pointer local_4a8;
  pointer puStack_4a0;
  pointer puStack_498;
  uint32_t local_490;
  uint32_t uStack_48c;
  uint8_t uStack_488;
  undefined3 uStack_487;
  uint32_t uStack_484;
  pointer local_480;
  pointer puStack_478;
  pointer puStack_470;
  pointer local_468;
  pointer puStack_460;
  pointer puStack_458;
  pointer local_450;
  pointer puStack_448;
  pointer puStack_440;
  pointer local_438;
  pointer puStack_430;
  pointer puStack_428;
  pointer local_420;
  pointer puStack_418;
  pointer puStack_410;
  string local_2c8;
  undefined1 local_2a8 [32];
  pointer puStack_288;
  pointer local_280;
  pointer local_278;
  pointer puStack_270;
  pointer local_268;
  pointer local_260;
  pointer puStack_258;
  pointer local_250;
  pointer local_248;
  pointer puStack_240;
  DescriptorKeyType *local_238;
  undefined1 local_230 [56];
  pointer puStack_1f8;
  pointer local_1f0;
  pointer puStack_1e8;
  pointer local_1e0;
  pointer puStack_1d8;
  pointer local_1d0;
  pointer local_1c8;
  pointer puStack_1c0;
  pointer local_1b8;
  pointer local_1b0;
  pointer puStack_1a8;
  bool local_1a0;
  undefined3 uStack_19f;
  NetType NStack_19c;
  pointer puStack_198;
  pointer local_190;
  pointer puStack_188;
  pointer local_180;
  pointer local_178;
  pointer puStack_170;
  uint32_t local_168;
  uint32_t uStack_164;
  uint8_t uStack_160;
  undefined3 uStack_15f;
  uint32_t uStack_15c;
  pointer local_158;
  pointer local_150;
  pointer puStack_148;
  pointer local_140;
  pointer local_138;
  pointer puStack_130;
  pointer local_128;
  pointer local_120;
  pointer puStack_118;
  pointer local_110;
  pointer local_108;
  pointer puStack_100;
  pointer local_f8;
  pointer local_f0;
  pointer puStack_e8;
  string local_e0;
  ByteData256 local_c0;
  undefined1 local_a8 [32];
  pointer puStack_88;
  pointer local_80;
  pointer local_78;
  pointer puStack_70;
  pointer local_68;
  pointer local_60;
  pointer puStack_58;
  pointer local_50;
  pointer puStack_48;
  pointer local_40;
  pointer puStack_38;
  
  DescriptorKeyReference::DescriptorKeyReference(__return_storage_ptr__);
  Pubkey::Pubkey(&local_570);
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  pcVar2 = (this->key_info_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c8,pcVar2,pcVar2 + (this->key_info_)._M_string_length);
  KeyData::KeyData((KeyData *)local_230);
  local_238 = &this->key_type_;
  DVar1 = this->key_type_;
  if (DVar1 - kDescriptorKeyBip32 < 2) {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    local_e0._M_string_length = 0;
    local_e0.field_2._M_local_buf[0] = '\0';
    bVar13 = 1;
    if (this->need_arg_num_ == 0) {
      arg = (string *)0x0;
      bVar9 = true;
    }
    else {
      if ((array_argument ==
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x0) ||
         (pbVar3 = (array_argument->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
         pbVar3 == (array_argument->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish)) {
        local_558._0_8_ = "cfdcore_descriptor.cpp";
        local_558._8_4_ = 0x765;
        local_558._16_8_ = "GetKeyReferences";
        logger::log<>((CfdSourceLocation *)local_558,kCfdLogLevelWarning,
                      "Failed to generate pubkey from hdkey.");
        pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
        local_558._0_8_ = local_558 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_558,"Failed to generate pubkey from hdkey.","");
        CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_558);
        __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_558._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_558 + 0x10);
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_558,"base","");
      puVar4 = (pointer)pbVar3->_M_string_length;
      if (puVar4 == (pointer)local_558._8_8_) {
        if (puVar4 == (pointer)0x0) {
          bVar9 = true;
        }
        else {
          iVar10 = bcmp((pbVar3->_M_dataplus)._M_p,(void *)local_558._0_8_,(size_t)puVar4);
          bVar9 = iVar10 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_558 + 0x10)) {
        operator_delete((void *)local_558._0_8_);
      }
      if (bVar9) {
        ::std::__cxx11::string::_M_assign((string *)&local_2c8);
        arg = (string *)0x0;
        bVar9 = true;
        bVar13 = 0;
      }
      else {
        ::std::__cxx11::string::_M_replace
                  ((ulong)&local_e0,0,(char *)local_e0._M_string_length,0x21aa53);
        arg = &local_e0;
        ::std::__cxx11::string::_M_assign((string *)arg);
        pbVar3 = (array_argument->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        (array_argument->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = pbVar3 + -1;
        pcVar5 = pbVar3[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5 != &pbVar3[-1].field_2) {
          operator_delete(pcVar5);
        }
        bVar9 = false;
      }
    }
    ExtPubkey::ExtPubkey((ExtPubkey *)local_2a8);
    ByteData256::ByteData256(&local_c0);
    if ((this->tweak_sum_)._M_string_length != 0) {
      ByteData256::ByteData256((ByteData256 *)local_558,&this->tweak_sum_);
      puVar4 = local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_558._0_8_;
      local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_558._8_8_;
      local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_558._16_8_;
      local_558._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_558._8_8_ = (pointer)0x0;
      local_558._16_8_ = (pointer)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar4 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(puVar4);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_558._0_8_);
      }
    }
    if (*local_238 == kDescriptorKeyBip32Priv) {
      ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_a8,&local_2c8,&local_c0);
      if (!bVar9) {
        ExtPrivkey::DerivePrivkey((ExtPrivkey *)local_558,(ExtPrivkey *)local_a8,&local_e0);
        uVar6 = local_a8._0_8_;
        local_a8._0_8_ = local_558._0_8_;
        local_a8._8_8_ = local_558._8_8_;
        local_a8._16_8_ = local_558._16_8_;
        local_558._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_558._8_8_ = (pointer)0x0;
        local_558._16_8_ = (pointer)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar6 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)uVar6);
        }
        puVar4 = local_80;
        local_a8._24_8_ = local_558._24_8_;
        puStack_88 = puStack_538;
        local_80 = puStack_530;
        local_78 = puStack_528;
        puStack_70 = puStack_520;
        puStack_530 = (pointer)0x0;
        puStack_528 = (pointer)0x0;
        puStack_520 = (pointer)0x0;
        if (puVar4 != (pointer)0x0) {
          operator_delete(puVar4);
        }
        puVar4 = local_68;
        local_68 = local_518;
        local_60 = puStack_510;
        puStack_58 = local_508;
        local_518 = (pointer)0x0;
        puStack_510 = (pointer)0x0;
        local_508 = (pointer)0x0;
        if (puVar4 != (pointer)0x0) {
          operator_delete(puVar4);
        }
        puVar4 = puStack_48;
        local_50 = puStack_500;
        puStack_48 = local_4f8;
        local_40 = puStack_4f0;
        puStack_38 = puStack_4e8;
        local_4f8 = (pointer)0x0;
        puStack_4f0 = (pointer)0x0;
        puStack_4e8 = (pointer)0x0;
        if (puVar4 != (pointer)0x0) {
          operator_delete(puVar4);
        }
        if (local_4f8 != (pointer)0x0) {
          operator_delete(local_4f8);
        }
        if (local_518 != (pointer)0x0) {
          operator_delete(local_518);
        }
        if (puStack_530 != (pointer)0x0) {
          operator_delete(puStack_530);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_558._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_558._0_8_);
        }
      }
      ExtPrivkey::GetExtPubkey((ExtPubkey *)local_558,(ExtPrivkey *)local_a8);
      uVar6 = local_2a8._0_8_;
      local_2a8._0_8_ = local_558._0_8_;
      local_2a8._8_8_ = local_558._8_8_;
      local_2a8._16_8_ = local_558._16_8_;
      local_558._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_558._8_8_ = (pointer)0x0;
      local_558._16_8_ = (pointer)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar6 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)uVar6);
      }
      puVar4 = local_280;
      local_2a8._24_8_ = local_558._24_8_;
      puStack_288 = puStack_538;
      local_280 = puStack_530;
      local_278 = puStack_528;
      puStack_270 = puStack_520;
      puStack_530 = (pointer)0x0;
      puStack_528 = (pointer)0x0;
      puStack_520 = (pointer)0x0;
      if (puVar4 != (pointer)0x0) {
        operator_delete(puVar4);
      }
      puVar4 = local_268;
      local_268 = local_518;
      local_260 = puStack_510;
      puStack_258 = local_508;
      local_518 = (pointer)0x0;
      puStack_510 = (pointer)0x0;
      local_508 = (pointer)0x0;
      if (puVar4 != (pointer)0x0) {
        operator_delete(puVar4);
      }
      puVar4 = local_250;
      local_250 = puStack_500;
      local_248 = local_4f8;
      puStack_240 = puStack_4f0;
      puStack_500 = (pointer)0x0;
      local_4f8 = (pointer)0x0;
      puStack_4f0 = (pointer)0x0;
      if (puVar4 != (pointer)0x0) {
        operator_delete(puVar4);
      }
      if (puStack_500 != (pointer)0x0) {
        operator_delete(puStack_500);
      }
      if (local_518 != (pointer)0x0) {
        operator_delete(local_518);
      }
      if (puStack_530 != (pointer)0x0) {
        operator_delete(puStack_530);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_558._0_8_);
      }
      DescriptorKeyReference::DescriptorKeyReference
                ((DescriptorKeyReference *)local_558,(ExtPrivkey *)local_a8,arg);
      DescriptorKeyReference::operator=(__return_storage_ptr__,(DescriptorKeyReference *)local_558);
      DescriptorKeyReference::~DescriptorKeyReference((DescriptorKeyReference *)local_558);
      if (puStack_48 != (pointer)0x0) {
        operator_delete(puStack_48);
      }
      if (local_68 != (pointer)0x0) {
        operator_delete(local_68);
      }
      if (local_80 != (pointer)0x0) {
        operator_delete(local_80);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_a8._0_8_);
      }
    }
    else {
      ExtPubkey::ExtPubkey((ExtPubkey *)local_558,&local_2c8,&local_c0);
      uVar6 = local_2a8._0_8_;
      local_2a8._0_8_ = local_558._0_8_;
      local_2a8._8_8_ = local_558._8_8_;
      local_2a8._16_8_ = local_558._16_8_;
      local_558._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_558._8_8_ = (pointer)0x0;
      local_558._16_8_ = (pointer)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar6 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)uVar6);
      }
      puVar4 = local_280;
      local_2a8._24_8_ = local_558._24_8_;
      puStack_288 = puStack_538;
      local_280 = puStack_530;
      local_278 = puStack_528;
      puStack_270 = puStack_520;
      puStack_530 = (pointer)0x0;
      puStack_528 = (pointer)0x0;
      puStack_520 = (pointer)0x0;
      if (puVar4 != (pointer)0x0) {
        operator_delete(puVar4);
      }
      puVar4 = local_268;
      local_268 = local_518;
      local_260 = puStack_510;
      puStack_258 = local_508;
      local_518 = (pointer)0x0;
      puStack_510 = (pointer)0x0;
      local_508 = (pointer)0x0;
      if (puVar4 != (pointer)0x0) {
        operator_delete(puVar4);
      }
      puVar4 = local_250;
      local_250 = puStack_500;
      local_248 = local_4f8;
      puStack_240 = puStack_4f0;
      puStack_500 = (pointer)0x0;
      local_4f8 = (pointer)0x0;
      puStack_4f0 = (pointer)0x0;
      if (puVar4 != (pointer)0x0) {
        operator_delete(puVar4);
      }
      if (puStack_500 != (pointer)0x0) {
        operator_delete(puStack_500);
      }
      if (local_518 != (pointer)0x0) {
        operator_delete(local_518);
      }
      if (puStack_530 != (pointer)0x0) {
        operator_delete(puStack_530);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_558._0_8_);
      }
      if (!bVar9) {
        ExtPubkey::DerivePubkey((ExtPubkey *)local_558,(ExtPubkey *)local_2a8,&local_e0);
        uVar6 = local_2a8._0_8_;
        local_2a8._0_8_ = local_558._0_8_;
        local_2a8._8_8_ = local_558._8_8_;
        local_2a8._16_8_ = local_558._16_8_;
        local_558._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_558._8_8_ = (pointer)0x0;
        local_558._16_8_ = (pointer)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar6 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)uVar6);
        }
        puVar4 = local_280;
        local_2a8._24_8_ = local_558._24_8_;
        puStack_288 = puStack_538;
        local_280 = puStack_530;
        local_278 = puStack_528;
        puStack_270 = puStack_520;
        puStack_530 = (pointer)0x0;
        puStack_528 = (pointer)0x0;
        puStack_520 = (pointer)0x0;
        if (puVar4 != (pointer)0x0) {
          operator_delete(puVar4);
        }
        puVar4 = local_268;
        local_268 = local_518;
        local_260 = puStack_510;
        puStack_258 = local_508;
        local_518 = (pointer)0x0;
        puStack_510 = (pointer)0x0;
        local_508 = (pointer)0x0;
        if (puVar4 != (pointer)0x0) {
          operator_delete(puVar4);
        }
        puVar4 = local_250;
        local_250 = puStack_500;
        local_248 = local_4f8;
        puStack_240 = puStack_4f0;
        puStack_500 = (pointer)0x0;
        local_4f8 = (pointer)0x0;
        puStack_4f0 = (pointer)0x0;
        if (puVar4 != (pointer)0x0) {
          operator_delete(puVar4);
        }
        if (puStack_500 != (pointer)0x0) {
          operator_delete(puStack_500);
        }
        if (local_518 != (pointer)0x0) {
          operator_delete(local_518);
        }
        if (puStack_530 != (pointer)0x0) {
          operator_delete(puStack_530);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_558._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_558._0_8_);
        }
      }
      DescriptorKeyReference::DescriptorKeyReference
                ((DescriptorKeyReference *)local_558,(ExtPubkey *)local_2a8,arg);
      DescriptorKeyReference::operator=(__return_storage_ptr__,(DescriptorKeyReference *)local_558);
      DescriptorKeyReference::~DescriptorKeyReference((DescriptorKeyReference *)local_558);
    }
    bVar8 = ExtPubkey::IsValid((ExtPubkey *)local_2a8);
    if (!bVar8) {
      local_558._0_8_ = "cfdcore_descriptor.cpp";
      local_558._8_4_ = 0x78e;
      local_558._16_8_ = "GetKeyReferences";
      logger::log<>((CfdSourceLocation *)local_558,kCfdLogLevelWarning,
                    "Failed to generate pubkey from hdkey.");
      pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
      local_558._0_8_ = local_558 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_558,"Failed to generate pubkey from hdkey.","");
      CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_558);
      __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ExtPubkey::GetPubkey((Pubkey *)local_558,(ExtPubkey *)local_2a8);
    puVar4 = local_570.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_570.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_558._0_8_;
    local_570.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_558._8_8_;
    local_570.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_558._16_8_;
    local_558._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_558._8_8_ = (pointer)0x0;
    local_558._16_8_ = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(puVar4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete((void *)local_558._0_8_);
    }
    if (((bool)(bVar9 & bVar13)) ||
       (((char *)local_e0._M_string_length != (char *)0x0 &&
        (lVar11 = ::std::__cxx11::string::find((char)&local_e0,0x2f), lVar11 == -1)))) {
      child_num = ExtPubkey::GetChildNum((ExtPubkey *)local_2a8);
      KeyData::KeyData((KeyData *)local_558,&this->value_,child_num,false);
      uVar6 = local_230._0_8_;
      local_230._0_8_ = local_558._0_8_;
      local_230._8_8_ = local_558._8_8_;
      local_230._16_8_ = local_558._16_8_;
      local_558._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_558._8_8_ = (pointer)0x0;
      local_558._16_8_ = (pointer)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar6 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)uVar6);
      }
      uVar6 = local_230._24_8_;
      local_230._24_8_ = local_558._24_8_;
      local_230._32_8_ = puStack_538;
      local_230._40_8_ = puStack_530;
      local_558._24_8_ = (pointer)0x0;
      puStack_538 = (pointer)0x0;
      puStack_530 = (pointer)0x0;
      if ((pointer)uVar6 != (pointer)0x0) {
        operator_delete((void *)uVar6);
      }
      puVar4 = puStack_1f8;
      local_230._48_8_ = puStack_528;
      puStack_1f8 = puStack_520;
      local_1f0 = local_518;
      puStack_1e8 = puStack_510;
      puStack_520 = (pointer)0x0;
      local_518 = (pointer)0x0;
      puStack_510 = (pointer)0x0;
      if (puVar4 != (pointer)0x0) {
        operator_delete(puVar4);
      }
      puVar4 = local_1d0;
      local_1e0 = local_508;
      puStack_1d8 = puStack_500;
      local_1d0 = local_4f8;
      local_1c8 = puStack_4f0;
      puStack_1c0 = puStack_4e8;
      local_4f8 = (pointer)0x0;
      puStack_4f0 = (pointer)0x0;
      puStack_4e8 = (pointer)0x0;
      if (puVar4 != (pointer)0x0) {
        operator_delete(puVar4);
      }
      puVar4 = local_1b8;
      local_1b8 = local_4e0;
      local_1b0 = puStack_4d8;
      puStack_1a8 = puStack_4d0;
      local_4e0 = (pointer)0x0;
      puStack_4d8 = (pointer)0x0;
      puStack_4d0 = (pointer)0x0;
      if (puVar4 != (pointer)0x0) {
        operator_delete(puVar4);
      }
      puVar4 = puStack_198;
      local_1a0 = local_4c8;
      uStack_19f = uStack_4c7;
      NStack_19c = NStack_4c4;
      puStack_198 = puStack_4c0;
      local_190 = local_4b8;
      puStack_188 = puStack_4b0;
      puStack_4c0 = (pointer)0x0;
      local_4b8 = (pointer)0x0;
      puStack_4b0 = (pointer)0x0;
      if (puVar4 != (pointer)0x0) {
        operator_delete(puVar4);
      }
      puVar4 = local_180;
      local_180 = local_4a8;
      local_178 = puStack_4a0;
      puStack_170 = puStack_498;
      local_4a8 = (pointer)0x0;
      puStack_4a0 = (pointer)0x0;
      puStack_498 = (pointer)0x0;
      if (puVar4 != (pointer)0x0) {
        operator_delete(puVar4);
      }
      puVar4 = local_158;
      local_168 = local_490;
      uStack_164 = uStack_48c;
      uStack_160 = uStack_488;
      uStack_15f = uStack_487;
      uStack_15c = uStack_484;
      local_158 = local_480;
      local_150 = puStack_478;
      puStack_148 = puStack_470;
      local_480 = (pointer)0x0;
      puStack_478 = (pointer)0x0;
      puStack_470 = (pointer)0x0;
      if (puVar4 != (pointer)0x0) {
        operator_delete(puVar4);
      }
      puVar4 = local_140;
      local_140 = local_468;
      local_138 = puStack_460;
      puStack_130 = puStack_458;
      local_468 = (pointer)0x0;
      puStack_460 = (pointer)0x0;
      puStack_458 = (pointer)0x0;
      if (puVar4 != (pointer)0x0) {
        operator_delete(puVar4);
      }
      puVar4 = local_128;
      local_128 = local_450;
      local_120 = puStack_448;
      puStack_118 = puStack_440;
      local_450 = (pointer)0x0;
      puStack_448 = (pointer)0x0;
      puStack_440 = (pointer)0x0;
      if (puVar4 != (pointer)0x0) {
        operator_delete(puVar4);
      }
      puVar7 = local_110;
      local_110 = local_438;
      local_108 = puStack_430;
      puStack_100 = puStack_428;
      local_438 = (pointer)0x0;
      puStack_430 = (pointer)0x0;
      puStack_428 = (pointer)0x0;
      if (puVar7 != (pointer)0x0) {
        operator_delete(puVar7);
      }
      puVar4 = local_f8;
      local_f8 = local_420;
      local_f0 = puStack_418;
      puStack_e8 = puStack_410;
      local_420 = (pointer)0x0;
      puStack_418 = (pointer)0x0;
      puStack_410 = (pointer)0x0;
      if (puVar4 != (pointer)0x0) {
        operator_delete(puVar4);
      }
      KeyData::~KeyData((KeyData *)local_558);
      DescriptorKeyReference::DescriptorKeyReference
                ((DescriptorKeyReference *)local_558,(KeyData *)local_230,arg);
      DescriptorKeyReference::operator=(__return_storage_ptr__,(DescriptorKeyReference *)local_558);
      DescriptorKeyReference::~DescriptorKeyReference((DescriptorKeyReference *)local_558);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_c0.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_250 != (pointer)0x0) {
      operator_delete(local_250);
    }
    if (local_268 != (pointer)0x0) {
      operator_delete(local_268);
    }
    if (local_280 != (pointer)0x0) {
      operator_delete(local_280);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete((void *)local_2a8._0_8_);
    }
    _Var14._M_p = local_e0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p == &local_e0.field_2) goto LAB_001942c4;
  }
  else {
    if (DVar1 != kDescriptorKeySchnorr) {
      if (DVar1 == kDescriptorKeyPublic) {
        Pubkey::Pubkey((Pubkey *)local_558,&this->key_info_);
        puVar4 = local_570.data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_570.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)local_558._0_8_;
        local_570.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)local_558._8_8_;
        local_570.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_558._16_8_;
        local_558._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_558._8_8_ = (pointer)0x0;
        local_558._16_8_ = (pointer)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar4 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(puVar4);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_558._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_558._0_8_);
        }
        DescriptorKeyReference::DescriptorKeyReference
                  ((DescriptorKeyReference *)local_558,&local_570);
        DescriptorKeyReference::operator=
                  (__return_storage_ptr__,(DescriptorKeyReference *)local_558);
        DescriptorKeyReference::~DescriptorKeyReference((DescriptorKeyReference *)local_558);
        KeyData::KeyData((KeyData *)local_558,&this->value_,-1,false);
        uVar6 = local_230._0_8_;
        local_230._0_8_ = local_558._0_8_;
        local_230._8_8_ = local_558._8_8_;
        local_230._16_8_ = local_558._16_8_;
        local_558._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_558._8_8_ = (pointer)0x0;
        local_558._16_8_ = (pointer)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar6 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)uVar6);
        }
        uVar6 = local_230._24_8_;
        local_230._24_8_ = local_558._24_8_;
        local_230._32_8_ = puStack_538;
        local_230._40_8_ = puStack_530;
        local_558._24_8_ = (pointer)0x0;
        puStack_538 = (pointer)0x0;
        puStack_530 = (pointer)0x0;
        if ((pointer)uVar6 != (pointer)0x0) {
          operator_delete((void *)uVar6);
        }
        puVar4 = puStack_1f8;
        local_230._48_8_ = puStack_528;
        puStack_1f8 = puStack_520;
        local_1f0 = local_518;
        puStack_1e8 = puStack_510;
        puStack_520 = (pointer)0x0;
        local_518 = (pointer)0x0;
        puStack_510 = (pointer)0x0;
        if (puVar4 != (pointer)0x0) {
          operator_delete(puVar4);
        }
        puVar4 = local_1d0;
        local_1e0 = local_508;
        puStack_1d8 = puStack_500;
        local_1d0 = local_4f8;
        local_1c8 = puStack_4f0;
        puStack_1c0 = puStack_4e8;
        local_4f8 = (pointer)0x0;
        puStack_4f0 = (pointer)0x0;
        puStack_4e8 = (pointer)0x0;
        if (puVar4 != (pointer)0x0) {
          operator_delete(puVar4);
        }
        puVar4 = local_1b8;
        local_1b8 = local_4e0;
        local_1b0 = puStack_4d8;
        puStack_1a8 = puStack_4d0;
        local_4e0 = (pointer)0x0;
        puStack_4d8 = (pointer)0x0;
        puStack_4d0 = (pointer)0x0;
        if (puVar4 != (pointer)0x0) {
          operator_delete(puVar4);
        }
        puVar4 = puStack_198;
        local_1a0 = local_4c8;
        uStack_19f = uStack_4c7;
        NStack_19c = NStack_4c4;
        puStack_198 = puStack_4c0;
        local_190 = local_4b8;
        puStack_188 = puStack_4b0;
        puStack_4c0 = (pointer)0x0;
        local_4b8 = (pointer)0x0;
        puStack_4b0 = (pointer)0x0;
        if (puVar4 != (pointer)0x0) {
          operator_delete(puVar4);
        }
        puVar4 = local_180;
        local_180 = local_4a8;
        local_178 = puStack_4a0;
        puStack_170 = puStack_498;
        local_4a8 = (pointer)0x0;
        puStack_4a0 = (pointer)0x0;
        puStack_498 = (pointer)0x0;
        if (puVar4 != (pointer)0x0) {
          operator_delete(puVar4);
        }
        puVar4 = local_158;
        local_168 = local_490;
        uStack_164 = uStack_48c;
        uStack_160 = uStack_488;
        uStack_15f = uStack_487;
        uStack_15c = uStack_484;
        local_158 = local_480;
        local_150 = puStack_478;
        puStack_148 = puStack_470;
        local_480 = (pointer)0x0;
        puStack_478 = (pointer)0x0;
        puStack_470 = (pointer)0x0;
        if (puVar4 != (pointer)0x0) {
          operator_delete(puVar4);
        }
        puVar4 = local_140;
        local_140 = local_468;
        local_138 = puStack_460;
        puStack_130 = puStack_458;
        local_468 = (pointer)0x0;
        puStack_460 = (pointer)0x0;
        puStack_458 = (pointer)0x0;
        if (puVar4 != (pointer)0x0) {
          operator_delete(puVar4);
        }
        puVar4 = local_128;
        local_128 = local_450;
        local_120 = puStack_448;
        puStack_118 = puStack_440;
        local_450 = (pointer)0x0;
        puStack_448 = (pointer)0x0;
        puStack_440 = (pointer)0x0;
        if (puVar4 != (pointer)0x0) {
          operator_delete(puVar4);
        }
        puVar7 = local_110;
        local_110 = local_438;
        local_108 = puStack_430;
        puStack_100 = puStack_428;
        local_438 = (pointer)0x0;
        puStack_430 = (pointer)0x0;
        puStack_428 = (pointer)0x0;
        if (puVar7 != (pointer)0x0) {
          operator_delete(puVar7);
        }
        puVar4 = local_f8;
        local_f8 = local_420;
        local_f0 = puStack_418;
        puStack_e8 = puStack_410;
        local_420 = (pointer)0x0;
        puStack_418 = (pointer)0x0;
        puStack_410 = (pointer)0x0;
        if (puVar4 != (pointer)0x0) {
          operator_delete(puVar4);
        }
        KeyData::~KeyData((KeyData *)local_558);
        DescriptorKeyReference::DescriptorKeyReference
                  ((DescriptorKeyReference *)local_558,(KeyData *)local_230,(string *)0x0);
        DescriptorKeyReference::operator=
                  (__return_storage_ptr__,(DescriptorKeyReference *)local_558);
        DescriptorKeyReference::~DescriptorKeyReference((DescriptorKeyReference *)local_558);
      }
      goto LAB_001942c4;
    }
    SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_a8,&this->key_info_);
    DescriptorKeyReference::DescriptorKeyReference
              ((DescriptorKeyReference *)local_558,(SchnorrPubkey *)local_a8);
    DescriptorKeyReference::operator=(__return_storage_ptr__,(DescriptorKeyReference *)local_558);
    DescriptorKeyReference::~DescriptorKeyReference((DescriptorKeyReference *)local_558);
    KeyData::KeyData((KeyData *)local_558,&this->value_,-1,true);
    uVar6 = local_230._0_8_;
    local_230._0_8_ = local_558._0_8_;
    local_230._8_8_ = local_558._8_8_;
    local_230._16_8_ = local_558._16_8_;
    local_558._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_558._8_8_ = (pointer)0x0;
    local_558._16_8_ = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)uVar6 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete((void *)uVar6);
    }
    uVar6 = local_230._24_8_;
    local_230._24_8_ = local_558._24_8_;
    local_230._32_8_ = puStack_538;
    local_230._40_8_ = puStack_530;
    local_558._24_8_ = (pointer)0x0;
    puStack_538 = (pointer)0x0;
    puStack_530 = (pointer)0x0;
    if ((pointer)uVar6 != (pointer)0x0) {
      operator_delete((void *)uVar6);
    }
    puVar4 = puStack_1f8;
    local_230._48_8_ = puStack_528;
    puStack_1f8 = puStack_520;
    local_1f0 = local_518;
    puStack_1e8 = puStack_510;
    puStack_520 = (pointer)0x0;
    local_518 = (pointer)0x0;
    puStack_510 = (pointer)0x0;
    if (puVar4 != (pointer)0x0) {
      operator_delete(puVar4);
    }
    puVar4 = local_1d0;
    local_1e0 = local_508;
    puStack_1d8 = puStack_500;
    local_1d0 = local_4f8;
    local_1c8 = puStack_4f0;
    puStack_1c0 = puStack_4e8;
    local_4f8 = (pointer)0x0;
    puStack_4f0 = (pointer)0x0;
    puStack_4e8 = (pointer)0x0;
    if (puVar4 != (pointer)0x0) {
      operator_delete(puVar4);
    }
    puVar4 = local_1b8;
    local_1b8 = local_4e0;
    local_1b0 = puStack_4d8;
    puStack_1a8 = puStack_4d0;
    local_4e0 = (pointer)0x0;
    puStack_4d8 = (pointer)0x0;
    puStack_4d0 = (pointer)0x0;
    if (puVar4 != (pointer)0x0) {
      operator_delete(puVar4);
    }
    puVar4 = puStack_198;
    local_1a0 = local_4c8;
    uStack_19f = uStack_4c7;
    NStack_19c = NStack_4c4;
    puStack_198 = puStack_4c0;
    local_190 = local_4b8;
    puStack_188 = puStack_4b0;
    puStack_4c0 = (pointer)0x0;
    local_4b8 = (pointer)0x0;
    puStack_4b0 = (pointer)0x0;
    if (puVar4 != (pointer)0x0) {
      operator_delete(puVar4);
    }
    puVar4 = local_180;
    local_180 = local_4a8;
    local_178 = puStack_4a0;
    puStack_170 = puStack_498;
    local_4a8 = (pointer)0x0;
    puStack_4a0 = (pointer)0x0;
    puStack_498 = (pointer)0x0;
    if (puVar4 != (pointer)0x0) {
      operator_delete(puVar4);
    }
    puVar4 = local_158;
    local_168 = local_490;
    uStack_164 = uStack_48c;
    uStack_160 = uStack_488;
    uStack_15f = uStack_487;
    uStack_15c = uStack_484;
    local_158 = local_480;
    local_150 = puStack_478;
    puStack_148 = puStack_470;
    local_480 = (pointer)0x0;
    puStack_478 = (pointer)0x0;
    puStack_470 = (pointer)0x0;
    if (puVar4 != (pointer)0x0) {
      operator_delete(puVar4);
    }
    puVar4 = local_140;
    local_140 = local_468;
    local_138 = puStack_460;
    puStack_130 = puStack_458;
    local_468 = (pointer)0x0;
    puStack_460 = (pointer)0x0;
    puStack_458 = (pointer)0x0;
    if (puVar4 != (pointer)0x0) {
      operator_delete(puVar4);
    }
    puVar4 = local_128;
    local_128 = local_450;
    local_120 = puStack_448;
    puStack_118 = puStack_440;
    local_450 = (pointer)0x0;
    puStack_448 = (pointer)0x0;
    puStack_440 = (pointer)0x0;
    if (puVar4 != (pointer)0x0) {
      operator_delete(puVar4);
    }
    puVar7 = local_110;
    local_110 = local_438;
    local_108 = puStack_430;
    puStack_100 = puStack_428;
    local_438 = (pointer)0x0;
    puStack_430 = (pointer)0x0;
    puStack_428 = (pointer)0x0;
    if (puVar7 != (pointer)0x0) {
      operator_delete(puVar7);
    }
    puVar4 = local_f8;
    local_f8 = local_420;
    local_f0 = puStack_418;
    puStack_e8 = puStack_410;
    local_420 = (pointer)0x0;
    puStack_418 = (pointer)0x0;
    puStack_410 = (pointer)0x0;
    if (puVar4 != (pointer)0x0) {
      operator_delete(puVar4);
    }
    KeyData::~KeyData((KeyData *)local_558);
    DescriptorKeyReference::DescriptorKeyReference
              ((DescriptorKeyReference *)local_558,(KeyData *)local_230,(string *)0x0);
    DescriptorKeyReference::operator=(__return_storage_ptr__,(DescriptorKeyReference *)local_558);
    DescriptorKeyReference::~DescriptorKeyReference((DescriptorKeyReference *)local_558);
    SchnorrPubkey::CreatePubkey((Pubkey *)local_558,(SchnorrPubkey *)local_a8,false);
    puVar4 = local_570.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_570.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_558._0_8_;
    local_570.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_558._8_8_;
    local_570.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_558._16_8_;
    local_558._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_558._8_8_ = (pointer)0x0;
    local_558._16_8_ = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(puVar4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete((void *)local_558._0_8_);
    }
    _Var14._M_p = (pointer)local_a8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_001942c4;
  }
  operator_delete(_Var14._M_p);
LAB_001942c4:
  bVar9 = Pubkey::IsValid(&local_570);
  if (!bVar9) {
    local_558._0_8_ = "cfdcore_descriptor.cpp";
    local_558._8_4_ = 0x7a3;
    local_558._16_8_ = "GetKeyReferences";
    logger::
    log<cfd::core::DescriptorNodeType_const&,cfd::core::DescriptorKeyType_const&,std::__cxx11::string&>
              ((CfdSourceLocation *)local_558,kCfdLogLevelWarning,
               "Failed to pubkey. type={}-{}, key_info={}",&this->node_type_,local_238,&local_2c8);
    pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
    local_558._0_8_ = local_558 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_558,"Invalid pubkey data.","")
    ;
    CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_558);
    __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
  }
  KeyData::~KeyData((KeyData *)local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_570.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

DescriptorKeyReference DescriptorNode::GetKeyReferences(
    std::vector<std::string>* array_argument) const {
  DescriptorKeyReference result;
  Pubkey pubkey;
  std::string using_key = key_info_;
  KeyData key_data;
  if (key_type_ == DescriptorKeyType::kDescriptorKeyPublic) {
    pubkey = Pubkey(key_info_);
    result = DescriptorKeyReference(pubkey);
    try {
      key_data = KeyData(value_);
      result = DescriptorKeyReference(key_data);
    } catch (const CfdException& except) {
      if (value_[0] == '[') throw except;
    }
  } else if (key_type_ == DescriptorKeyType::kDescriptorKeySchnorr) {
    SchnorrPubkey schnorr_pubkey = SchnorrPubkey(key_info_);
    result = DescriptorKeyReference(schnorr_pubkey);
    try {
      key_data = KeyData(value_, -1, true);
      result = DescriptorKeyReference(key_data);
    } catch (const CfdException& except) {
      if (value_[0] == '[') throw except;
    }
    pubkey = schnorr_pubkey.CreatePubkey();
  } else if (
      (key_type_ == DescriptorKeyType::kDescriptorKeyBip32) ||
      (key_type_ == DescriptorKeyType::kDescriptorKeyBip32Priv)) {
    std::string arg_value;
    std::string* arg_pointer = nullptr;
    uint32_t need_arg_num = need_arg_num_;
    bool has_base = false;
    if (need_arg_num == 0) {
      // Fixed key. For strengthened keys, xprv/tprv is required.
    } else if ((array_argument == nullptr) || array_argument->empty()) {
      warn(CFD_LOG_SOURCE, "Failed to generate pubkey from hdkey.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to generate pubkey from hdkey.");
    } else if (
        (array_argument != nullptr) && (!array_argument->empty()) &&
        (array_argument->at(0) == std::string(kArgumentBaseExtkey))) {
      using_key = base_extkey_;
      need_arg_num = 0;
      has_base = true;
    } else {
      // Dynamic key generation. For strengthened keys, xprv/tprv is required.
      // If array_argument is nullptr, set it to 0 temporarily.
      // (For generate test)
      arg_value = "0";
      if (array_argument != nullptr) {
        arg_value = array_argument->back();
        array_argument->pop_back();
      }
      arg_pointer = &arg_value;
    }

    ExtPubkey xpub;
    ByteData256 tweak_sum;
    if (!tweak_sum_.empty()) tweak_sum = ByteData256(tweak_sum_);
    if (key_type_ == DescriptorKeyType::kDescriptorKeyBip32Priv) {
      ExtPrivkey xpriv(using_key, tweak_sum);
      if (need_arg_num != 0) {
        xpriv = xpriv.DerivePrivkey(arg_value);
      }
      xpub = xpriv.GetExtPubkey();
      result = DescriptorKeyReference(xpriv, arg_pointer);
    } else {
      xpub = ExtPubkey(using_key, tweak_sum);
      if (need_arg_num != 0) {
        xpub = xpub.DerivePubkey(arg_value);
      }
      result = DescriptorKeyReference(xpub, arg_pointer);
    }

    if (!xpub.IsValid()) {
      warn(CFD_LOG_SOURCE, "Failed to generate pubkey from hdkey.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to generate pubkey from hdkey.");
    }
    pubkey = xpub.GetPubkey();

    try {
      if (((need_arg_num == 0) && (!has_base)) ||
          ((!arg_value.empty()) &&
           (arg_value.find('/') == std::string::npos))) {
        key_data = KeyData(value_, static_cast<int32_t>(xpub.GetChildNum()));
        result = DescriptorKeyReference(key_data, arg_pointer);
      }
    } catch (const CfdException& except) {
      if (value_[0] == '[') throw except;
    }
  }

  if (!pubkey.IsValid()) {
    warn(
        CFD_LOG_SOURCE, "Failed to pubkey. type={}-{}, key_info={}",
        node_type_, key_type_, using_key);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid pubkey data.");
  }
  return result;
}